

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_tester.hpp
# Opt level: O0

bool __thiscall duckdb::CAPITester::OpenDatabase(CAPITester *this,char *path)

{
  int iVar1;
  undefined8 in_RSI;
  CAPITester *in_RDI;
  bool local_1;
  
  Cleanup(in_RDI);
  iVar1 = duckdb_open(in_RSI,in_RDI);
  if (iVar1 == 0) {
    iVar1 = duckdb_connect(in_RDI->database,&in_RDI->connection);
    if (iVar1 == 0) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OpenDatabase(const char *path) {
		Cleanup();
		if (duckdb_open(path, &database) != DuckDBSuccess) {
			return false;
		}
		if (duckdb_connect(database, &connection) != DuckDBSuccess) {
			return false;
		}
		return true;
	}